

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

bool __thiscall
Fossilize::DatabaseInterface::test_resource_filter
          (DatabaseInterface *this,ResourceTag tag,Hash hash)

{
  Impl *pIVar1;
  _Head_base<0UL,_Fossilize::DatabaseInterface_*,_false> _Var2;
  DatabaseInterface *pDVar3;
  ulong uVar4;
  char cVar5;
  int iVar6;
  size_type sVar7;
  Hash local_18;
  
  uVar4 = (ulong)tag;
  pIVar1 = this->impl;
  local_18 = hash;
  if ((pIVar1->whitelist_tag_mask >> (tag & 0x1f) & 1) != 0) {
    _Var2._M_head_impl =
         (pIVar1->whitelist)._M_t.
         super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
         ._M_t.
         super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
         .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
    if (_Var2._M_head_impl == (DatabaseInterface *)0x0) {
      if ((pIVar1->sub_databases_in_whitelist).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (pIVar1->sub_databases_in_whitelist).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_00147a6c;
    }
    else {
      cVar5 = (**(code **)((long)(_Var2._M_head_impl)->_vptr_DatabaseInterface + 0x28))
                        (_Var2._M_head_impl,uVar4);
      if (cVar5 != '\0') goto LAB_00147a6c;
    }
    sVar7 = std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&this->impl->implicit_whitelisted[uVar4]._M_h,&local_18);
    if (sVar7 == 0) {
      return false;
    }
  }
LAB_00147a6c:
  pDVar3 = (this->impl->blacklist)._M_t.
           super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
           .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
  if ((pDVar3 != (DatabaseInterface *)0x0) &&
     (iVar6 = (*pDVar3->_vptr_DatabaseInterface[5])(pDVar3,uVar4,local_18), (char)iVar6 != '\0')) {
    return false;
  }
  return true;
}

Assistant:

bool DatabaseInterface::test_resource_filter(ResourceTag tag, Hash hash) const
{
	if ((impl->whitelist_tag_mask & (1u << tag)) != 0)
	{
		bool whitelist_sensitive = impl->whitelist || !impl->sub_databases_in_whitelist.empty();
		if (whitelist_sensitive)
		{
			bool whitelisted = (impl->whitelist && impl->whitelist->has_entry(tag, hash)) ||
			                   (impl->implicit_whitelisted[tag].count(hash) != 0);
			if (!whitelisted)
				return false;
		}
	}

	if (impl->blacklist && impl->blacklist->has_entry(tag, hash))
		return false;

	return true;
}